

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

_Bool next_value_greater_than_reporting_level_upper_bound
                (hdr_iter *iter,int64_t reporting_level_upper_bound)

{
  int64_t iVar1;
  int64_t reporting_level_upper_bound_local;
  hdr_iter *iter_local;
  
  if (iter->counts_index < iter->h->counts_len) {
    iVar1 = peek_next_value_from_index(iter);
    iter_local._7_1_ = reporting_level_upper_bound < iVar1;
  }
  else {
    iter_local._7_1_ = false;
  }
  return iter_local._7_1_;
}

Assistant:

static bool next_value_greater_than_reporting_level_upper_bound(
    struct hdr_iter *iter, int64_t reporting_level_upper_bound)
{
    if (iter->counts_index >= iter->h->counts_len)
    {
        return false;
    }

    return peek_next_value_from_index(iter) > reporting_level_upper_bound;
}